

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::ShaderOptimizationCase::iterate
          (ShaderOptimizationCase *this)

{
  ShaderPerformanceMeasurer *this_00;
  int iVar1;
  ostringstream *poVar2;
  State SVar3;
  CaseShaderType CVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log;
  TestContext *this_01;
  int precision;
  IterateResult IVar5;
  char *pcVar6;
  float fVar7;
  float val;
  ScopedLogSection section;
  ScopedLogSection local_1d8;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  log = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  SVar3 = this->m_state;
  switch(SVar3) {
  case STATE_INIT_UNOPTIMIZED:
  case STATE_INIT_OPTIMIZED:
    IVar5 = CONTINUE;
    deqp::gls::ShaderPerformanceMeasurer::init
              (&this->m_measurer,
               (EVP_PKEY_CTX *)
               (ulong)(((&this->m_unoptimizedProgram)[SVar3 == STATE_INIT_OPTIMIZED].m_ptr)->
                      m_program).m_program);
    this->m_state = (uint)(SVar3 == STATE_INIT_OPTIMIZED) * 2 + STATE_MEASURE_UNOPTIMIZED;
    break;
  case STATE_MEASURE_UNOPTIMIZED:
  case STATE_MEASURE_OPTIMIZED:
    this_00 = &this->m_measurer;
    deqp::gls::ShaderPerformanceMeasurer::iterate(this_00);
    IVar5 = CONTINUE;
    if ((this->m_measurer).m_state == STATE_FINISHED) {
      SVar3 = this->m_state;
      pcVar6 = "UnoptimizedResult";
      if (SVar3 == STATE_MEASURE_OPTIMIZED) {
        pcVar6 = "OptimizedResult";
      }
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,pcVar6,
                 pcVar6 + (ulong)(SVar3 != STATE_MEASURE_OPTIMIZED) * 2 + 0xf);
      pcVar6 = "Measurement result for unoptimized program";
      if (SVar3 == STATE_MEASURE_OPTIMIZED) {
        pcVar6 = "Measurement results for hand-optimized program";
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,pcVar6,
                 pcVar6 + (ulong)(SVar3 == STATE_MEASURE_OPTIMIZED) * 4 + 0x2a);
      tcu::ScopedLogSection::ScopedLogSection
                (&local_1d8,(TestLog *)&log->_M_allocated_capacity,(string *)local_1b0,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      deqp::gls::ShaderPerformanceMeasurer::logMeasurementInfo
                (this_00,(TestLog *)&log->_M_allocated_capacity);
      (&this->m_unoptimizedResult)[SVar3 == STATE_MEASURE_OPTIMIZED] = (this->m_measurer).m_result;
      deqp::gls::ShaderPerformanceMeasurer::deinit(this_00);
      this->m_state =
           (SVar3 == STATE_MEASURE_OPTIMIZED) + 2 + (uint)(SVar3 == STATE_MEASURE_OPTIMIZED);
      tcu::TestLog::endSection(local_1d8.m_log);
    }
    break;
  default:
    CVar4 = this->m_caseShaderType;
    val = (&(this->m_unoptimizedResult).megaVertPerSec)[CVar4 != CASESHADERTYPE_VERTEX] /
          (&(this->m_optimizedResult).megaVertPerSec)[CVar4 != CASESHADERTYPE_VERTEX];
    fVar7 = floorf(100.0 / val + 0.5);
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Unoptimized / optimized ",0x18);
    pcVar6 = "Vertex and fragment";
    if (CVar4 == CASESHADERTYPE_VERTEX) {
      pcVar6 = "Unexpected vertex";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,pcVar6 + 0xb,(ulong)(CVar4 != CASESHADERTYPE_VERTEX) * 2 + 6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2," performance ratio: ",0x14);
    std::ostream::_M_insert<double>((double)val);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    iVar1 = (int)fVar7 + -100;
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    poVar2 = (ostringstream *)(local_1b0 + 8);
    if (iVar1 < 0) {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Note: hand-optimization degraded performance by ",0x30);
      std::ostream::operator<<(poVar2,100 - (int)fVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"%",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Note: ",6);
      std::ostream::operator<<(poVar2,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"% performance gain was achieved with hand-optimized version",
                 0x3b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_((string *)local_1b0,(de *)0x2,val,precision);
    tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,(char *)local_1b0._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    IVar5 = STOP;
  }
  return IVar5;
}

Assistant:

ShaderOptimizationCase::IterateResult ShaderOptimizationCase::iterate (void)
{
	TestLog& log = m_testCtx.getLog();

	if (m_state == STATE_INIT_UNOPTIMIZED || m_state == STATE_INIT_OPTIMIZED)
	{
		const bool optimized = m_state == STATE_INIT_OPTIMIZED;
		m_measurer.init(program(optimized)->getProgram(), programData(optimized).attributes, 1);
		m_state = optimized ? STATE_MEASURE_OPTIMIZED : STATE_MEASURE_UNOPTIMIZED;

		return CONTINUE;
	}
	else if (m_state == STATE_MEASURE_UNOPTIMIZED || m_state == STATE_MEASURE_OPTIMIZED)
	{
		m_measurer.iterate();

		if (m_measurer.isFinished())
		{
			const bool						optimized	= m_state == STATE_MEASURE_OPTIMIZED;
			const tcu::ScopedLogSection		section		(log, optimized ? "OptimizedResult"									: "UnoptimizedResult",
															  optimized ? "Measurement results for hand-optimized program"	: "Measurement result for unoptimized program");
			m_measurer.logMeasurementInfo(log);
			result(optimized) = m_measurer.getResult();
			m_measurer.deinit();
			m_state = optimized ? STATE_FINISHED : STATE_INIT_OPTIMIZED;
		}

		return CONTINUE;
	}
	else
	{
		DE_ASSERT(m_state == STATE_FINISHED);

		const float			unoptimizedRelevantResult	= m_caseShaderType == CASESHADERTYPE_VERTEX ? m_unoptimizedResult.megaVertPerSec	: m_unoptimizedResult.megaFragPerSec;
		const float			optimizedRelevantResult		= m_caseShaderType == CASESHADERTYPE_VERTEX ? m_optimizedResult.megaVertPerSec		: m_optimizedResult.megaFragPerSec;
		const char* const	relevantResultName			= m_caseShaderType == CASESHADERTYPE_VERTEX ? "vertex"								: "fragment";
		const float			ratio						= unoptimizedRelevantResult / optimizedRelevantResult;
		const int			handOptimizationGain		= (int)deFloatRound(100.0f/ratio) - 100;

		log << TestLog::Message << "Unoptimized / optimized " << relevantResultName << " performance ratio: " << ratio << TestLog::EndMessage;

		if (handOptimizationGain >= 0)
			log << TestLog::Message << "Note: " << handOptimizationGain << "% performance gain was achieved with hand-optimized version" << TestLog::EndMessage;
		else
			log << TestLog::Message << "Note: hand-optimization degraded performance by " << -handOptimizationGain << "%" << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(ratio, 2).c_str());

		return STOP;
	}
}